

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TicsSpecs.hpp
# Opt level: O1

string * __thiscall
sciplot::TicsSpecs::repr_abi_cxx11_(string *__return_storage_ptr__,TicsSpecs *this)

{
  ostream *poVar1;
  string baserepr;
  stringstream ss;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  TicsSpecsBaseOf<sciplot::TicsSpecs>::repr_abi_cxx11_
            (&local_1e0,&this->super_TicsSpecsBaseOf<sciplot::TicsSpecs>);
  if ((this->super_TicsSpecsBaseOf<sciplot::TicsSpecs>).super_ShowSpecsOf<sciplot::TicsSpecs>.m_show
      == false) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_1e0._M_dataplus._M_p,
               local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_190,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,(this->m_depth)._M_dataplus._M_p,(this->m_depth)._M_string_length);
    std::__cxx11::stringbuf::str();
    internal::removeExtraWhitespaces(__return_storage_ptr__,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto TicsSpecs::repr() const -> std::string
{
    const auto baserepr = TicsSpecsBaseOf<TicsSpecs>::repr();

    if(isHidden())
        return baserepr;

    std::stringstream ss;
    ss << baserepr << " ";
    ss << m_depth;
    return internal::removeExtraWhitespaces(ss.str());
}